

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  archive_rb_tree *rbt;
  size_t min;
  char *p;
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  zip *pzVar6;
  uLong uVar7;
  char *pcVar8;
  int iVar9;
  wchar_t wVar10;
  uint uVar11;
  zip_entry *pzVar12;
  archive_rb_node *paVar13;
  void *pvVar14;
  time_t tVar15;
  la_int64_t lVar16;
  Bytef *p_00;
  long lVar17;
  int *piVar18;
  Bytef *__src;
  ushort uVar19;
  char *__s;
  long request;
  uchar *puVar20;
  ulong n;
  char *pcVar21;
  archive_rb_node *paVar22;
  archive_string *as;
  int64_t iVar23;
  archive_rb_tree *paVar24;
  archive_rb_node *paVar25;
  archive_rb_node *paVar26;
  Bytef *local_90;
  archive_string local_68;
  archive_entry *local_50;
  archive_rb_tree *local_48;
  long local_40;
  long local_38;
  
  pzVar6 = (zip *)a->format->data;
  if (pzVar6->has_encrypted_entries == -1) {
    pzVar6->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (pzVar6->zip_entries == (zip_entry *)0x0) {
    local_50 = entry;
    iVar23 = __archive_read_seek(a,pzVar6->central_directory_offset,0);
    if (iVar23 < 0) {
      return L'\xffffffe2';
    }
    pvVar14 = __archive_read_ahead(a,0x14,&local_40);
    if (pvVar14 == (void *)0x0) {
      return L'\xffffffe2';
    }
    while (local_40 < 5) {
      iVar23 = 0;
LAB_003e58e9:
      __archive_read_consume(a,iVar23);
      pvVar14 = __archive_read_ahead(a,0x14,&local_40);
      if (pvVar14 == (void *)0x0) {
        return L'\xffffffe2';
      }
    }
    iVar23 = 0;
LAB_003e588e:
    cVar1 = *(char *)((long)pvVar14 + iVar23 + 3);
    switch(cVar1) {
    case '\x01':
    case '\x05':
      goto switchD_003e58a2_caseD_1;
    case '\x02':
      if (*(int *)((long)pvVar14 + iVar23) != 0x2014b50) goto switchD_003e58a2_caseD_3;
LAB_003e590f:
      __archive_read_consume(a,iVar23);
      lVar16 = archive_filter_bytes(&a->archive,0);
      local_38 = lVar16 - pzVar6->central_directory_offset;
      rbt = &pzVar6->tree;
      __archive_rb_tree_init(rbt,&rb_ops);
      local_48 = &pzVar6->tree_rsrc;
      __archive_rb_tree_init(local_48,&rb_rsrc_ops);
      pzVar6->central_directory_entries_total = 0;
      piVar18 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
      goto joined_r0x003e596e;
    case '\x03':
    case '\x04':
switchD_003e58a2_caseD_3:
      iVar23 = iVar23 + 4;
      goto LAB_003e58e0;
    case '\x06':
      if ((*(int *)((long)pvVar14 + iVar23) == 0x6054b50) ||
         (*(int *)((long)pvVar14 + iVar23) == 0x6064b50)) goto LAB_003e590f;
      goto switchD_003e58a2_caseD_1;
    default:
      if (cVar1 == 'P') {
        iVar23 = iVar23 + 3;
      }
      else {
        if (cVar1 != 'K') goto switchD_003e58a2_caseD_3;
        iVar23 = iVar23 + 2;
      }
      goto LAB_003e58e0;
    }
  }
  if (pzVar6->entry == (zip_entry *)0x0) {
    return L'\x01';
  }
  pzVar12 = (zip_entry *)__archive_rb_tree_iterate(&pzVar6->tree,&pzVar6->entry->node,1);
  pzVar6->entry = pzVar12;
LAB_003e580d:
  if (pzVar12 == (zip_entry *)0x0) {
    return L'\x01';
  }
  pcVar21 = (pzVar12->rsrcname).s;
  if (pcVar21 == (char *)0x0) {
    paVar13 = (archive_rb_node *)0x0;
  }
  else {
    paVar13 = __archive_rb_tree_find_node(&pzVar6->tree_rsrc,pcVar21);
  }
  if (pzVar6->cctx_valid != '\0') {
    aes_ctr_release(&pzVar6->cctx);
  }
  if (pzVar6->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&pzVar6->hctx);
  }
  pzVar6->hctx_valid = '\0';
  pzVar6->cctx_valid = '\0';
  pzVar6->tctx_valid = '\0';
  __archive_read_reset_passphrase(a);
  lVar16 = archive_filter_bytes(&a->archive,0);
  lVar17 = pzVar6->entry->local_header_offset;
  request = lVar17 - lVar16;
  if (request == 0 || lVar17 < lVar16) {
    if (request != 0) {
      __archive_read_seek(a,lVar17,0);
    }
  }
  else {
    __archive_read_consume(a,request);
  }
  pzVar6->unconsumed = 0;
  wVar10 = zip_read_local_file_header(a,entry,pzVar6);
  if (wVar10 != L'\0') {
    return wVar10;
  }
  if (paVar13 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  pzVar6 = (zip *)a->format->data;
  lVar16 = archive_filter_bytes(&a->archive,0);
  bVar2 = *(byte *)(paVar13[5].rb_nodes + 1);
  if (bVar2 == 0) {
    paVar26 = paVar13[2].rb_nodes[0];
    if (paVar26 != (archive_rb_node *)paVar13[1].rb_info) {
      pcVar21 = "Malformed OS X metadata entry: inconsistent size";
LAB_003e5ec9:
      iVar9 = 0x54;
      goto LAB_003e5ed1;
    }
  }
  else {
    if (bVar2 != 8) {
      lVar17 = 8;
      paVar26 = (archive_rb_node *)0x502b94;
      do {
        if (*(uint *)((long)&PTR_bid_keyword_keys_u_00600348 + lVar17) == (uint)bVar2) {
          paVar26 = *(archive_rb_node **)((long)&compression_methods[0].id + lVar17);
          break;
        }
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x178);
      pcVar21 = "Unsupported ZIP compression method (%s)";
      goto LAB_003e5eb4;
    }
    paVar26 = paVar13[2].rb_nodes[0];
  }
  if (0x400000 < (long)paVar26) {
    pcVar21 = "Mac metadata is too large: %jd > 4M bytes";
LAB_003e5eb4:
    archive_set_error(&a->archive,0x54,pcVar21,paVar26);
    return L'\xffffffec';
  }
  if (0x400000 < (long)paVar13[1].rb_info) {
    pcVar21 = "Mac metadata is too large: %jd > 4M bytes";
    paVar26 = (archive_rb_node *)paVar13[1].rb_info;
    goto LAB_003e5eb4;
  }
  p_00 = (Bytef *)malloc((size_t)paVar26);
  if (p_00 == (Bytef *)0x0) {
    pcVar21 = "Can\'t allocate memory for Mac metadata";
    iVar9 = 0xc;
LAB_003e5ed1:
    archive_set_error(&a->archive,iVar9,pcVar21);
    return L'\xffffffe2';
  }
  paVar26 = paVar13[1].rb_nodes[1];
  lVar17 = (long)paVar26 - lVar16;
  if (lVar17 == 0 || (long)paVar26 < lVar16) {
    if (lVar17 != 0) {
      __archive_read_seek(a,(int64_t)paVar26,0);
    }
  }
  else {
    __archive_read_consume(a,lVar17);
  }
  piVar18 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  if (piVar18 == (int *)0x0) {
    pcVar21 = "Truncated ZIP file header";
    iVar9 = 0x54;
  }
  else {
    if (*piVar18 == 0x4034b50) {
      iVar23 = (ulong)*(ushort *)((long)piVar18 + 0x1a) + (ulong)*(ushort *)(piVar18 + 7) + 0x1e;
      goto LAB_003e5f9a;
    }
    pcVar21 = "Damaged Zip archive";
    iVar9 = -1;
  }
  archive_set_error(&a->archive,iVar9,pcVar21);
  iVar23 = -0x14;
LAB_003e5f9a:
  __archive_read_consume(a,iVar23);
  paVar26 = (archive_rb_node *)paVar13[1].rb_info;
  paVar22 = paVar13[2].rb_nodes[0];
  paVar25 = paVar22;
  if (paVar26 != (archive_rb_node *)0x0) {
    local_90 = p_00;
    local_50 = entry;
    do {
      __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_68);
      if (__src == (Bytef *)0x0) {
        archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
        wVar10 = L'\xffffffec';
        goto LAB_003e615f;
      }
      if (paVar26 < local_68.s) {
        local_68.s = (char *)paVar26;
      }
      if (*(char *)(paVar13[5].rb_nodes + 1) == '\b') {
        wVar10 = zip_deflate_init(a,pzVar6);
        if (wVar10 != L'\0') goto LAB_003e615f;
        (pzVar6->stream).next_in = __src;
        (pzVar6->stream).avail_in = (uInt)local_68.s;
        (pzVar6->stream).total_in = 0;
        (pzVar6->stream).next_out = local_90;
        (pzVar6->stream).avail_out = (uInt)paVar25;
        (pzVar6->stream).total_out = 0;
        uVar11 = cm_zlib_inflate(&pzVar6->stream,0);
        if (1 < uVar11) {
          if (uVar11 == 0xfffffffc) {
            archive_set_error(&a->archive,0xc,"Out of memory for ZIP decompression");
          }
          else {
            archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)",(ulong)uVar11);
          }
          wVar10 = L'\xffffffe2';
          goto LAB_003e615f;
        }
        paVar22 = (archive_rb_node *)(pzVar6->stream).total_in;
        uVar7 = (pzVar6->stream).total_out;
        paVar25 = (archive_rb_node *)((long)paVar25 - uVar7);
        local_90 = local_90 + uVar7;
      }
      else if (*(char *)(paVar13[5].rb_nodes + 1) == '\0') {
        if (paVar25 < local_68.s) {
          local_68.s = (char *)paVar25;
        }
        memcpy(local_90,__src,(size_t)local_68.s);
        local_90 = local_90 + (long)local_68.s;
        paVar25 = (archive_rb_node *)((long)paVar25 - (long)local_68.s);
        uVar11 = (uint)(paVar25 == (archive_rb_node *)0x0);
        paVar22 = (archive_rb_node *)local_68.s;
      }
      else {
        uVar11 = 0;
        paVar22 = (archive_rb_node *)0x0;
      }
      __archive_read_consume(a,(int64_t)paVar22);
    } while ((uVar11 == 0) &&
            (paVar26 = (archive_rb_node *)((long)paVar26 - (long)paVar22),
            paVar26 != (archive_rb_node *)0x0));
    paVar22 = paVar13[2].rb_nodes[0];
    entry = local_50;
  }
  archive_entry_copy_mac_metadata(entry,p_00,(long)paVar22 - (long)paVar25);
  wVar10 = L'\0';
LAB_003e615f:
  __archive_read_seek(a,lVar16,0);
  pzVar6->decompress_init = '\0';
  free(p_00);
  return wVar10 >> 0x1f & wVar10;
joined_r0x003e596e:
  if (piVar18 == (int *)0x0) {
    return L'\xffffffe2';
  }
  if ((*piVar18 == 0x6064b50) || (*piVar18 == 0x6054b50)) {
    pzVar12 = (zip_entry *)__archive_rb_tree_iterate(rbt,(archive_rb_node *)0x0,0);
    pzVar6->entry = pzVar12;
    entry = local_50;
    goto LAB_003e580d;
  }
  if (*piVar18 != 0x2014b50) {
    pcVar21 = "Invalid central directory signature";
    iVar9 = -1;
    goto LAB_003e5ed1;
  }
  pvVar14 = __archive_read_ahead(a,0x2e,(ssize_t *)0x0);
  if (pvVar14 == (void *)0x0) {
    return L'\xffffffe2';
  }
  pzVar12 = (zip_entry *)calloc(1,0x90);
  pzVar12->next = pzVar6->zip_entries;
  pzVar12->flags = '\x02';
  pzVar6->zip_entries = pzVar12;
  pzVar6->central_directory_entries_total = pzVar6->central_directory_entries_total + 1;
  pzVar12->system = *(uchar *)((long)pvVar14 + 5);
  bVar2 = *(byte *)((long)pvVar14 + 8);
  pzVar12->zip_flags = *(uint16_t *)((long)pvVar14 + 8);
  if ((bVar2 & 0x41) != 0) {
    pzVar6->has_encrypted_entries = 1;
  }
  pzVar12->compression = *(uchar *)((long)pvVar14 + 10);
  tVar15 = zip_time((char *)((long)pvVar14 + 0xc));
  pzVar12->mtime = tVar15;
  pzVar12->cm_zlib_crc32 = *(uint32_t *)((long)pvVar14 + 0x10);
  puVar20 = (uchar *)((long)pvVar14 + 0x13);
  if ((pzVar12->zip_flags & 8) != 0) {
    puVar20 = (uchar *)((long)pvVar14 + 0xd);
  }
  pzVar12->decdat = *puVar20;
  pzVar12->compressed_size = (ulong)*(uint *)((long)pvVar14 + 0x14);
  pzVar12->uncompressed_size = (ulong)*(uint *)((long)pvVar14 + 0x18);
  uVar3 = *(ushort *)((long)pvVar14 + 0x1c);
  n = (ulong)uVar3;
  uVar4 = *(ushort *)((long)pvVar14 + 0x1e);
  uVar5 = *(ushort *)((long)pvVar14 + 0x20);
  uVar11 = *(uint *)((long)pvVar14 + 0x26);
  pzVar12->local_header_offset = (ulong)*(uint *)((long)pvVar14 + 0x2a) + local_38;
  if (pzVar12->system == '\0') {
    uVar19 = 0x41fd;
    if ((uVar11 & 0x10) == 0) {
      uVar19 = 0x81b4;
    }
    pzVar12->mode = uVar19;
    if ((uVar11 & 1) != 0) {
      pzVar12->mode = uVar19 & 0x16d;
    }
  }
  else if (pzVar12->system == '\x03') {
    pzVar12->mode = (uint16_t)(uVar11 >> 0x10);
  }
  else {
    pzVar12->mode = 0;
  }
  __archive_read_consume(a,0x2e);
  min = n + uVar4;
  pcVar21 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
  if (pcVar21 == (char *)0x0) {
    pcVar21 = "Truncated ZIP file header";
    goto LAB_003e5ec9;
  }
  p = pcVar21 + n;
  wVar10 = process_extra(a,p,(ulong)uVar4,pzVar12);
  if (wVar10 != L'\0') {
    return L'\xffffffe2';
  }
  pcVar8 = pcVar21;
  if (pzVar6->process_mac_extensions == 0) {
    __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar12);
  }
  else {
    do {
      __s = pcVar8;
      pvVar14 = memchr(__s,0x2f,(long)p - (long)__s);
      pcVar8 = (char *)((long)pvVar14 + 1);
    } while (pvVar14 != (void *)0x0);
    if ((uVar3 < 9) || (iVar9 = strncmp("__MACOSX/",pcVar21,9), iVar9 != 0)) {
      as = &pzVar12->rsrcname;
      (pzVar12->rsrcname).length = 0;
      archive_strncat(as,"__MACOSX/",9);
      archive_strncat(as,pcVar21,(long)__s - (long)pcVar21);
      archive_strcat(as,"._");
      archive_strncat(as,__s,n - ((long)__s - (long)pcVar21));
      paVar24 = rbt;
    }
    else {
      if ((p[-1] != '/') && ((((long)__s - (long)pcVar21 < 3 || (*__s != '.')) || (__s[1] != '_'))))
      {
        __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar12);
        local_68.s = (char *)0x0;
        local_68.length = 0;
        local_68.buffer_length = 0;
        archive_strncat(&local_68,pcVar21,n);
        pcVar21 = strrchr(local_68.s,0x2f);
        paVar24 = local_48;
        while (pcVar21 != (char *)0x0) {
          *pcVar21 = '\0';
          paVar13 = __archive_rb_tree_find_node(paVar24,local_68.s);
          if (paVar13 == (archive_rb_node *)0x0) break;
          __archive_rb_tree_remove_node(paVar24,paVar13);
          archive_string_free((archive_string *)(paVar13 + 3));
          __archive_rb_tree_insert_node(rbt,paVar13);
          pcVar21 = strrchr(local_68.s,0x2f);
        }
        archive_string_free(&local_68);
        goto LAB_003e5c01;
      }
      (pzVar12->rsrcname).length = 0;
      archive_strncat(&pzVar12->rsrcname,pcVar21,n);
      paVar24 = local_48;
    }
    __archive_rb_tree_insert_node(paVar24,(archive_rb_node *)pzVar12);
  }
LAB_003e5c01:
  __archive_read_consume(a,min + uVar5);
  piVar18 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
  goto joined_r0x003e596e;
switchD_003e58a2_caseD_1:
  iVar23 = iVar23 + 1;
LAB_003e58e0:
  if (local_40 + -4 <= iVar23) goto LAB_003e58e9;
  goto LAB_003e588e;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW)
		zip->has_encrypted_entries = 0;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;
	__archive_read_reset_passphrase(a);

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid redundant
	 * data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset,
		    SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}